

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O1

Interval * deqp::egl::approximateInt(Interval *__return_storage_ptr__,int i)

{
  Interval margin;
  Interval local_60;
  Interval local_48;
  Interval local_30;
  
  local_30.m_hasNaN = false;
  local_30.m_lo = -1.0;
  local_30.m_hi = 1.0;
  local_60.m_lo = (double)i;
  local_60.m_hasNaN = false;
  local_60.m_hi = local_60.m_lo;
  tcu::operator+(&local_48,&local_60,&local_30);
  if (INFINITY <= local_48.m_hi) {
    local_48.m_hi = INFINITY;
  }
  __return_storage_ptr__->m_hasNaN = false;
  __return_storage_ptr__->m_lo = (double)(-(ulong)(0.0 <= local_48.m_lo) & (ulong)local_48.m_lo);
  __return_storage_ptr__->m_hi = local_48.m_hi;
  return __return_storage_ptr__;
}

Assistant:

Interval approximateInt (int i)
{
	const Interval margin(-1.0, 1.0); // The resolution may be rounded

	return (Interval(i) + margin) & Interval(0.0, TCU_INFINITY);
}